

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O0

void HotKey_ToggleFullScreen(void)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  SDL_Surface *screen;
  
  puVar2 = (uint *)SDL_GetVideoSurface();
  iVar1 = SDL_WM_ToggleFullScreen(puVar2);
  if (iVar1 == 0) {
    printf("Unable to toggle fullscreen mode\n");
  }
  else {
    pcVar3 = "windowed";
    if ((*puVar2 & 0x80000000) != 0) {
      pcVar3 = "fullscreen";
    }
    printf("Toggled fullscreen mode - now %s\n",pcVar3);
  }
  return;
}

Assistant:

void HotKey_ToggleFullScreen(void)
{
	SDL_Surface *screen;

	screen = SDL_GetVideoSurface();
	if ( SDL_WM_ToggleFullScreen(screen) ) {
		printf("Toggled fullscreen mode - now %s\n",
		    (screen->flags&SDL_FULLSCREEN) ? "fullscreen" : "windowed");
	} else {
		printf("Unable to toggle fullscreen mode\n");
	}
}